

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::eqz(Literal *__return_storage_ptr__,Literal *this)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  
  switch((this->type).id) {
  case 0:
  case 1:
  case 6:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x3c6);
  case 2:
    local_28.func.super_IString.str._M_len =
         (ulong)(uint)local_28.func.super_IString.str._M_len._4_4_ << 0x20;
    local_18 = 2;
    eq(__return_storage_ptr__,this,(Literal *)&local_28.func);
    break;
  case 3:
    local_28.i64 = 0;
    local_18 = 3;
    eq(__return_storage_ptr__,this,(Literal *)&local_28.func);
    break;
  case 4:
    local_28.func.super_IString.str._M_len =
         (ulong)(uint)local_28.func.super_IString.str._M_len._4_4_ << 0x20;
    local_18 = 4;
    eq(__return_storage_ptr__,this,(Literal *)&local_28.func);
    break;
  case 5:
    local_28.i64 = 0;
    local_18 = 5;
    eq(__return_storage_ptr__,this,(Literal *)&local_28.func);
    break;
  default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  ~Literal((Literal *)&local_28.func);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::eqz() const {
  switch (type.getBasic()) {
    case Type::i32:
      return eq(Literal(int32_t(0)));
    case Type::i64:
      return eq(Literal(int64_t(0)));
    case Type::f32:
      return eq(Literal(float(0)));
    case Type::f64:
      return eq(Literal(double(0)));
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}